

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int channel_send_eof(LIBSSH2_CHANNEL *channel)

{
  LIBSSH2_SESSION *session;
  int iVar1;
  int iVar2;
  uchar packet [5];
  uchar local_1d;
  uchar local_1c [4];
  
  session = channel->session;
  local_1d = '`';
  _libssh2_htonu32(local_1c,(channel->remote).id);
  iVar2 = 0;
  iVar1 = _libssh2_transport_send(session,&local_1d,5,(uchar *)0x0,0);
  if (iVar1 == 0) {
    (channel->local).eof = '\x01';
  }
  else if (iVar1 == -0x25) {
    iVar2 = -0x25;
    _libssh2_error(session,-0x25,"Would block sending EOF");
  }
  else {
    iVar2 = _libssh2_error(session,-7,"Unable to send EOF on channel");
  }
  return iVar2;
}

Assistant:

static int channel_send_eof(LIBSSH2_CHANNEL *channel)
{
    LIBSSH2_SESSION *session = channel->session;
    unsigned char packet[5];    /* packet_type(1) + channelno(4) */
    int rc;

    _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                   "Sending EOF on channel %lu/%lu",
                   channel->local.id, channel->remote.id));
    packet[0] = SSH_MSG_CHANNEL_EOF;
    _libssh2_htonu32(packet + 1, channel->remote.id);
    rc = _libssh2_transport_send(session, packet, 5, NULL, 0);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        _libssh2_error(session, rc,
                       "Would block sending EOF");
        return rc;
    }
    else if(rc) {
        return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                              "Unable to send EOF on channel");
    }
    channel->local.eof = 1;

    return 0;
}